

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::setEncryptionOptions(QPDFJob *this,QPDFWriter *w)

{
  bool bVar1;
  bool bVar2;
  Pipeline *pPVar3;
  element_type *peVar4;
  runtime_error *this_00;
  code *pcVar5;
  undefined *puVar6;
  int iVar7;
  QPDFLogger local_38;
  
  peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar7 = peVar4->keylen;
  if (iVar7 == 0x28) {
    iVar7 = 2;
LAB_001852f3:
    bVar1 = true;
    bVar2 = false;
  }
  else {
    if (iVar7 == 0x100) {
      iVar7 = 6 - (uint)peVar4->force_R5;
      bVar2 = false;
    }
    else {
      if (iVar7 != 0x80) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error((logic_error *)this_00,"bad encryption keylen");
        puVar6 = &std::logic_error::typeinfo;
        pcVar5 = std::logic_error::~logic_error;
        goto LAB_001855a6;
      }
      iVar7 = 4;
      bVar2 = true;
      if ((peVar4->force_V4 == false) && (peVar4->cleartext_metadata == false)) {
        if (peVar4->use_aes == false) {
          iVar7 = 3;
          goto LAB_001852f3;
        }
        bVar2 = true;
      }
    }
    if (peVar4->r3_accessibility == false) {
      QPDFLogger::getError
                (&local_38,
                 SUB81((peVar4->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,0));
      pPVar3 = Pipeline::operator<<
                         ((Pipeline *)
                          local_38.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,&((this->m).
                             super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->message_prefix);
      pPVar3 = Pipeline::operator<<(pPVar3,": -accessibility=n is ignored for modern");
      Pipeline::operator<<(pPVar3," encryption formats\n");
      if (local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    bVar1 = false;
  }
  maybeFixWritePassword(this,iVar7,&peVar4->user_password);
  maybeFixWritePassword
            (this,iVar7,
             &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              owner_password);
  if (bVar1) {
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else if ((!bVar2) ||
          (peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr, peVar4->use_aes != false)) goto LAB_001853b0;
  if (peVar4->allow_weak_crypto == false) {
    QPDFLogger::getError
              (&local_38,
               SUB81((peVar4->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,0));
    pPVar3 = Pipeline::operator<<
                       ((Pipeline *)
                        local_38.m.
                        super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->message_prefix);
    Pipeline::operator<<
              (pPVar3,
               ": refusing to write a file with RC4, a weak cryptographic algorithm\nPlease use 256-bit keys for better security.\nPass --allow-weak-crypto to enable writing insecure files.\nSee also https://qpdf.readthedocs.io/en/stable/weak-crypto.html\n"
              );
    if (local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"refusing to write a file with weak crypto");
    puVar6 = &std::runtime_error::typeinfo;
    pcVar5 = std::runtime_error::~runtime_error;
LAB_001855a6:
    __cxa_throw(this_00,puVar6,pcVar5);
  }
LAB_001853b0:
  peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(code *)(&DAT_00262750 + *(int *)(&DAT_00262750 + (ulong)(iVar7 - 2) * 4)))
            (&DAT_00262750 + *(int *)(&DAT_00262750 + (ulong)(iVar7 - 2) * 4),
             (peVar4->user_password)._M_dataplus._M_p,(peVar4->owner_password)._M_dataplus._M_p);
  return;
}

Assistant:

void
QPDFJob::setEncryptionOptions(QPDFWriter& w)
{
    int R = 0;
    if (m->keylen == 40) {
        R = 2;
    } else if (m->keylen == 128) {
        if (m->force_V4 || m->cleartext_metadata || m->use_aes) {
            R = 4;
        } else {
            R = 3;
        }
    } else if (m->keylen == 256) {
        if (m->force_R5) {
            R = 5;
        } else {
            R = 6;
        }
    } else {
        throw std::logic_error("bad encryption keylen");
    }
    if ((R > 3) && (m->r3_accessibility == false)) {
        *m->log->getError() << m->message_prefix << ": -accessibility=n is ignored for modern"
                            << " encryption formats\n";
    }
    maybeFixWritePassword(R, m->user_password);
    maybeFixWritePassword(R, m->owner_password);
    if ((R < 4) || ((R == 4) && (!m->use_aes))) {
        if (!m->allow_weak_crypto) {
            QTC::TC("qpdf", "QPDFJob weak crypto error");
            *m->log->getError()
                << m->message_prefix
                << ": refusing to write a file with RC4, a weak cryptographic algorithm\n"
                   "Please use 256-bit keys for better security.\n"
                   "Pass --allow-weak-crypto to enable writing insecure files.\n"
                   "See also https://qpdf.readthedocs.io/en/stable/weak-crypto.html\n";
            throw std::runtime_error("refusing to write a file with weak crypto");
        }
    }
    switch (R) {
    case 2:
        w.setR2EncryptionParametersInsecure(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r2_print,
            m->r2_modify,
            m->r2_extract,
            m->r2_annotate);
        break;
    case 3:
        w.setR3EncryptionParametersInsecure(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r3_accessibility,
            m->r3_extract,
            m->r3_assemble,
            m->r3_annotate_and_form,
            m->r3_form_filling,
            m->r3_modify_other,
            m->r3_print);
        break;
    case 4:
        w.setR4EncryptionParametersInsecure(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r3_accessibility,
            m->r3_extract,
            m->r3_assemble,
            m->r3_annotate_and_form,
            m->r3_form_filling,
            m->r3_modify_other,
            m->r3_print,
            !m->cleartext_metadata,
            m->use_aes);
        break;
    case 5:
        w.setR5EncryptionParameters(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r3_accessibility,
            m->r3_extract,
            m->r3_assemble,
            m->r3_annotate_and_form,
            m->r3_form_filling,
            m->r3_modify_other,
            m->r3_print,
            !m->cleartext_metadata);
        break;
    case 6:
        w.setR6EncryptionParameters(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r3_accessibility,
            m->r3_extract,
            m->r3_assemble,
            m->r3_annotate_and_form,
            m->r3_form_filling,
            m->r3_modify_other,
            m->r3_print,
            !m->cleartext_metadata);
        break;
    default:
        throw std::logic_error("bad encryption R value");
        break;
    }
}